

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::__exception_ptr::exception_ptr_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<std::__exception_ptr::exception_ptr_const&> *this,exception_ptr *rhs)

{
  lest *this_00;
  void *pvVar1;
  void *pvVar2;
  exception_ptr *in_R8;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  pvVar1 = *(void **)this_00;
  pvVar2 = rhs->_M_exception_object;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"==",&local_71);
  to_string<std::__exception_ptr::exception_ptr,std::__exception_ptr::exception_ptr>
            (&local_70,this_00,(exception_ptr *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = pvVar1 == pvVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }